

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::Loop::GetInductionInitValue(Loop *this,Instruction *induction,int64_t *value)

{
  IRContext *pIVar1;
  CFG *pCVar2;
  Instruction *this_00;
  ConstantManager *this_01;
  uint64_t *puVar3;
  uint32_t uVar4;
  int iVar5;
  mapped_type *ppBVar6;
  size_type sVar7;
  Instruction *this_02;
  Constant *this_03;
  undefined4 extraout_var;
  uint64_t uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t local_48;
  uint32_t local_44;
  uint64_t *local_40;
  DefUseManager *local_38;
  
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  uVar9 = (induction->has_result_id_ & 1) + 1;
  if (induction->has_type_id_ == false) {
    uVar9 = (uint)induction->has_result_id_;
  }
  uVar10 = 0;
  local_40 = (uint64_t *)value;
  if (uVar9 == (int)((ulong)((long)(induction->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(induction->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555) {
    this_02 = (Instruction *)0x0;
  }
  else {
    local_38 = (pIVar1->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    this_02 = (Instruction *)0x0;
    do {
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar1);
      }
      uVar9 = (induction->has_result_id_ & 1) + 1;
      if (induction->has_type_id_ == false) {
        uVar9 = (uint)induction->has_result_id_;
      }
      pCVar2 = (pIVar1->cfg_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
               _M_t.
               super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
               .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
      local_48 = Instruction::GetSingleWordOperand(induction,uVar9 + uVar10 + 1);
      ppBVar6 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&pCVar2->id2block_,&local_48);
      this_00 = ((*ppBVar6)->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar4 = 0;
      if (this_00->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
      }
      local_44 = uVar4;
      sVar7 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(this->loop_basic_blocks_)._M_h,&local_44);
      if (sVar7 == 0) {
        uVar9 = (induction->has_result_id_ & 1) + 1;
        if (induction->has_type_id_ == false) {
          uVar9 = (uint)induction->has_result_id_;
        }
        uVar4 = Instruction::GetSingleWordOperand(induction,uVar9 + uVar10);
        this_02 = analysis::DefUseManager::GetDef(local_38,uVar4);
      }
      uVar10 = uVar10 + 2;
      uVar9 = (induction->has_result_id_ & 1) + 1;
      if (induction->has_type_id_ == false) {
        uVar9 = (uint)induction->has_result_id_;
      }
    } while (uVar10 < (int)((ulong)((long)(induction->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(induction->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555 - uVar9);
  }
  if (this_02 != (Instruction *)0x0) {
    pIVar1 = this->context_;
    if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
      IRContext::BuildConstantManager(pIVar1);
    }
    this_01 = (pIVar1->constant_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl
    ;
    uVar4 = 0;
    if (this_02->has_result_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
    }
    this_03 = analysis::ConstantManager::FindDeclaredConstant(this_01,uVar4);
    puVar3 = local_40;
    if (this_03 != (Constant *)0x0) {
      if (local_40 == (uint64_t *)0x0) {
        return true;
      }
      iVar5 = (*this_03->type_->_vptr_Type[10])();
      if (CONCAT44(extraout_var,iVar5) != 0) {
        if (*(char *)(CONCAT44(extraout_var,iVar5) + 0x28) == '\x01') {
          uVar8 = analysis::Constant::GetSignExtendedValue(this_03);
        }
        else {
          uVar8 = analysis::Constant::GetZeroExtendedValue(this_03);
        }
        *puVar3 = uVar8;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Loop::GetInductionInitValue(const Instruction* induction,
                                 int64_t* value) const {
  Instruction* constant_instruction = nullptr;
  analysis::DefUseManager* def_use_manager = context_->get_def_use_mgr();

  for (uint32_t operand_id = 0; operand_id < induction->NumInOperands();
       operand_id += 2) {
    BasicBlock* bb = context_->cfg()->block(
        induction->GetSingleWordInOperand(operand_id + 1));

    if (!IsInsideLoop(bb)) {
      constant_instruction = def_use_manager->GetDef(
          induction->GetSingleWordInOperand(operand_id));
    }
  }

  if (!constant_instruction) return false;

  const analysis::Constant* constant =
      context_->get_constant_mgr()->FindDeclaredConstant(
          constant_instruction->result_id());
  if (!constant) return false;

  if (value) {
    const analysis::Integer* type = constant->type()->AsInteger();
    if (!type) {
      return false;
    }

    *value = type->IsSigned() ? constant->GetSignExtendedValue()
                              : constant->GetZeroExtendedValue();
  }

  return true;
}